

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsExport.cpp
# Opt level: O0

char * helicsQueryExecuteComplete(HelicsQuery query,HelicsError *err)

{
  bool bVar1;
  QueryObject *pQVar2;
  QueryId *in_stack_00000050;
  Federate *in_stack_00000058;
  QueryObject *queryObj;
  shared_ptr<helics::Federate> *in_stack_ffffffffffffff78;
  element_type *in_stack_ffffffffffffff80;
  HelicsQuery in_stack_ffffffffffffff88;
  IdentifierId<unsigned_int,_(helics::Identifiers)113,_4294967295U> local_6c [10];
  IdentifierId<unsigned_int,_(helics::Identifiers)113,_4294967295U> local_44 [3];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd0;
  char *local_8;
  
  pQVar2 = anon_unknown.dwarf_1a6d0::getQueryObj
                     (in_stack_ffffffffffffff88,(HelicsError *)in_stack_ffffffffffffff80);
  if (pQVar2 == (QueryObject *)0x0) {
    local_8 = 
    "{{\n  \"error\":{{\n    \"code\":400,\n    \"message\":\"query object is not valid\"\n  }}\n}}"
    ;
  }
  else {
    bVar1 = helics::IdentifierId<unsigned_int,_(helics::Identifiers)113,_4294967295U>::isValid
                      (&pQVar2->asyncIndexCode);
    if (bVar1) {
      in_stack_ffffffffffffff80 =
           std::__shared_ptr_access<helics::Federate,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<helics::Federate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x1a3206);
      helics::IdentifierId<unsigned_int,_(helics::Identifiers)113,_4294967295U>::IdentifierId
                (local_44,&pQVar2->asyncIndexCode);
      helics::Federate::queryComplete_abi_cxx11_(in_stack_00000058,in_stack_00000050);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffff80);
    }
    pQVar2->activeAsync = false;
    std::shared_ptr<helics::Federate>::shared_ptr
              ((shared_ptr<helics::Federate> *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    std::shared_ptr<helics::Federate>::operator=
              ((shared_ptr<helics::Federate> *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    std::shared_ptr<helics::Federate>::~shared_ptr((shared_ptr<helics::Federate> *)0x1a32c4);
    helics::IdentifierId<unsigned_int,_(helics::Identifiers)113,_4294967295U>::IdentifierId
              (local_6c);
    (pQVar2->asyncIndexCode).ivalue = local_6c[0].ivalue;
    local_8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_ffffffffffffff80);
  }
  return local_8;
}

Assistant:

const char* helicsQueryExecuteComplete(HelicsQuery query, HelicsError* err)
{
    auto* queryObj = getQueryObj(query, err);
    if (queryObj == nullptr) {
        return invalidQueryObConst;
    }
    try {
        if (queryObj->asyncIndexCode.isValid()) {
            queryObj->response = queryObj->activeFed->queryComplete(queryObj->asyncIndexCode);
        }
        queryObj->activeAsync = false;
        queryObj->activeFed = nullptr;
        queryObj->asyncIndexCode = helics::QueryId();
        return queryObj->response.c_str();
    }
    // LCOV_EXCL_START
    catch (...) {
        helicsErrorHandler(err);
    }
    return queryErrorString;
    // LCOV_EXCL_STOP
}